

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::BVFixed(BVFixed *this,BVIndex length,bool initialSet)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool initialSet_local;
  BVIndex length_local;
  BVFixed *this_local;
  
  this->len = length;
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0x10,"(length != 0)","length != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (initialSet) {
    SetAll(this);
  }
  else {
    ClearAll(this);
  }
  return;
}

Assistant:

BVFixed::BVFixed(BVIndex length, bool initialSet) :
    len(length)
{
    Assert(length != 0);
    if (initialSet)
    {
        this->SetAll();
    }
    else
    {
        this->ClearAll();
    }
}